

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

int64_t wallet::ParseISO8601DateTime(string *str)

{
  int iVar1;
  time_duration_type tVar2;
  locale *__other;
  time_input_facet<boost::posix_time::ptime,_char,_std::istreambuf_iterator<char,_std::char_traits<char>_>_>
  *this;
  long lVar3;
  long in_FS_OFFSET;
  ptime ptime;
  istringstream iss;
  ptime local_1c0;
  locale local_1b8;
  string_type local_1b0 [3];
  ios_base local_138 [264];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (ParseISO8601DateTime(std::__cxx11::string_const&)::epoch == '\0') {
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      ParseISO8601DateTime::epoch = boost::posix_time::from_time_t(0);
      __cxa_guard_release(&ParseISO8601DateTime(std::__cxx11::string_const&)::epoch);
    }
  }
  if (ParseISO8601DateTime(std::__cxx11::string_const&)::loc == '\0') {
    iVar1 = __cxa_guard_acquire(&ParseISO8601DateTime(std::__cxx11::string_const&)::loc);
    if (iVar1 != 0) {
      __other = (locale *)std::locale::classic();
      this = (time_input_facet<boost::posix_time::ptime,_char,_std::istreambuf_iterator<char,_std::char_traits<char>_>_>
              *)operator_new(0x240);
      local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"%Y-%m-%dT%H:%M:%SZ","");
      boost::date_time::
      time_input_facet<boost::posix_time::ptime,_char,_std::istreambuf_iterator<char,_std::char_traits<char>_>_>
      ::time_input_facet(this,local_1b0,0);
      std::locale::
      locale<boost::date_time::time_input_facet<boost::posix_time::ptime,char,std::istreambuf_iterator<char,std::char_traits<char>>>>
                (&ParseISO8601DateTime::loc,__other,this);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
        operator_delete(local_1b0[0]._M_dataplus._M_p,local_1b0[0].field_2._M_allocated_capacity + 1
                       );
      }
      __cxa_atexit(std::locale::~locale,&ParseISO8601DateTime::loc,&__dso_handle);
      __cxa_guard_release(&ParseISO8601DateTime(std::__cxx11::string_const&)::loc);
    }
  }
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)str,_S_in);
  std::ios::imbue((locale *)&local_1b8);
  std::locale::~locale(&local_1b8);
  local_1c0.
  super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  .time_.time_count_.value_ =
       (base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
        )boost::date_time::
         counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>
         ::get_time_rep(not_a_date_time);
  boost::posix_time::operator>>
            ((basic_istream<char,_std::char_traits<char>_> *)local_1b0,&local_1c0);
  lVar3 = 0;
  if ((local_1c0.
       super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
       .time_.time_count_.value_ != (time_rep_type)0x7ffffffffffffffe) &&
     ((long)ParseISO8601DateTime::epoch.
            super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
            .time_.time_count_.value_ <=
      (long)local_1c0.
            super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
            .time_.time_count_.value_)) {
    tVar2 = boost::date_time::
            counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>
            ::subtract_times((time_rep_type *)&local_1c0,
                             (time_rep_type *)&ParseISO8601DateTime::epoch);
    lVar3 = (long)tVar2.
                  super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                  .ticks_.value_ / 1000000;
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return lVar3;
  }
  __stack_chk_fail();
}

Assistant:

int64_t ParseISO8601DateTime(const std::string& str)
{
    static const boost::posix_time::ptime epoch = boost::posix_time::from_time_t(0);
    static const std::locale loc(std::locale::classic(),
        new boost::posix_time::time_input_facet("%Y-%m-%dT%H:%M:%SZ"));
    std::istringstream iss(str);
    iss.imbue(loc);
    boost::posix_time::ptime ptime(boost::date_time::not_a_date_time);
    iss >> ptime;
    if (ptime.is_not_a_date_time() || epoch > ptime)
        return 0;
    return (ptime - epoch).total_seconds();
}